

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuParamsStd(dstu_params *params,char *name)

{
  bool_t bVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x110);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    memSet(in_RDI,(octet)((ulong)in_RSI >> 0x38),0x17470f);
    iVar2 = strCmp(in_RDI,in_RSI);
    if (iVar2 == 0) {
      memCopy(in_RDI,in_RSI,0x17473e);
      in_RDI[8] = _curve163pb_A;
      memCopy(in_RDI,in_RSI,0x174766);
      memCopy(in_RDI,in_RSI,0x174780);
      *(uint *)(in_RDI + 0x8c) = (uint)_curve163pb_c;
      memCopy(in_RDI,in_RSI,0x1747af);
      local_4 = 0;
    }
    else {
      iVar2 = strCmp(in_RDI,in_RSI);
      if (iVar2 == 0) {
        memCopy(in_RDI,in_RSI,0x1747e7);
        in_RDI[8] = _curve167pb_A;
        memCopy(in_RDI,in_RSI,0x17480f);
        memCopy(in_RDI,in_RSI,0x174829);
        *(uint *)(in_RDI + 0x8c) = (uint)_curve167pb_c;
        local_4 = 0;
      }
      else {
        iVar2 = strCmp(in_RDI,in_RSI);
        if (iVar2 == 0) {
          memCopy(in_RDI,in_RSI,0x174873);
          in_RDI[8] = _curve173pb_A;
          memCopy(in_RDI,in_RSI,0x17489b);
          memCopy(in_RDI,in_RSI,0x1748b5);
          *(uint *)(in_RDI + 0x8c) = (uint)_curve173pb_c;
          local_4 = 0;
        }
        else {
          iVar2 = strCmp(in_RDI,in_RSI);
          if (iVar2 == 0) {
            memCopy(in_RDI,in_RSI,0x1748ff);
            in_RDI[8] = _curve179pb_A;
            memCopy(in_RDI,in_RSI,0x174927);
            memCopy(in_RDI,in_RSI,0x174941);
            *(uint *)(in_RDI + 0x8c) = (uint)_curve179pb_c;
            local_4 = 0;
          }
          else {
            iVar2 = strCmp(in_RDI,in_RSI);
            if (iVar2 == 0) {
              memCopy(in_RDI,in_RSI,0x17498b);
              in_RDI[8] = _curve191pb_A;
              memCopy(in_RDI,in_RSI,0x1749b3);
              memCopy(in_RDI,in_RSI,0x1749cd);
              *(uint *)(in_RDI + 0x8c) = (uint)_curve191pb_c;
              local_4 = 0;
            }
            else {
              iVar2 = strCmp(in_RDI,in_RSI);
              if (iVar2 == 0) {
                memCopy(in_RDI,in_RSI,0x174a17);
                in_RDI[8] = _curve233pb_A;
                memCopy(in_RDI,in_RSI,0x174a3f);
                memCopy(in_RDI,in_RSI,0x174a59);
                *(uint *)(in_RDI + 0x8c) = (uint)_curve233pb_c;
                local_4 = 0;
              }
              else {
                iVar2 = strCmp(in_RDI,in_RSI);
                if (iVar2 == 0) {
                  memCopy(in_RDI,in_RSI,0x174aa3);
                  in_RDI[8] = _curve257pb_A;
                  memCopy(in_RDI,in_RSI,0x174acb);
                  memCopy(in_RDI,in_RSI,0x174ae5);
                  *(uint *)(in_RDI + 0x8c) = (uint)_curve257pb_c;
                  local_4 = 0;
                }
                else {
                  iVar2 = strCmp(in_RDI,in_RSI);
                  if (iVar2 == 0) {
                    memCopy(in_RDI,in_RSI,0x174b2f);
                    in_RDI[8] = _curve307pb_A;
                    memCopy(in_RDI,in_RSI,0x174b57);
                    memCopy(in_RDI,in_RSI,0x174b71);
                    *(uint *)(in_RDI + 0x8c) = (uint)_curve307pb_c;
                    local_4 = 0;
                  }
                  else {
                    iVar2 = strCmp(in_RDI,in_RSI);
                    if (iVar2 == 0) {
                      memCopy(in_RDI,in_RSI,0x174bbb);
                      in_RDI[8] = _curve367pb_A;
                      memCopy(in_RDI,in_RSI,0x174be3);
                      memCopy(in_RDI,in_RSI,0x174bfd);
                      *(uint *)(in_RDI + 0x8c) = (uint)_curve367pb_c;
                      local_4 = 0;
                    }
                    else {
                      iVar2 = strCmp(in_RDI,in_RSI);
                      if (iVar2 == 0) {
                        memCopy(in_RDI,in_RSI,0x174c47);
                        in_RDI[8] = _curve431pb_A;
                        memCopy(in_RDI,in_RSI,0x174c6f);
                        memCopy(in_RDI,in_RSI,0x174c89);
                        *(uint *)(in_RDI + 0x8c) = (uint)_curve431pb_c;
                        local_4 = 0;
                      }
                      else {
                        local_4 = 0xca;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t dstuParamsStd(dstu_params* params, const char* name)
{
	if (!memIsValid(params, sizeof(dstu_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(dstu_params));
	if (strEq(name, _curve163pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve163pb);
		memCopy(params->P, _curve163pb_P, sizeof(_curve163pb_P));
		return ERR_OK;
	}
	if (strEq(name, _curve167pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve167pb);
		return ERR_OK;
	}
	if (strEq(name, _curve173pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve173pb);
		return ERR_OK;
	}
	if (strEq(name, _curve179pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve179pb);
		return ERR_OK;
	}
	if (strEq(name, _curve191pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve191pb);
		return ERR_OK;
	}
	if (strEq(name, _curve233pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve233pb);
		return ERR_OK;
	}
	if (strEq(name, _curve257pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve257pb);
		return ERR_OK;
	}
	if (strEq(name, _curve307pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve307pb);
		return ERR_OK;
	}
	if (strEq(name, _curve367pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve367pb);
		return ERR_OK;
	}
	if (strEq(name, _curve431pb_name))
	{
		_LOAD_NAMED_PARAMS(params, curve431pb);
		return ERR_OK;
	}
	return ERR_FILE_NOT_FOUND;
}